

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Transmitter_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Transmitter_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Transmitter PDU-\n");
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1e0,&this->super_Radio_Communications_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Radio Entity Type:          ");
  DATA_TYPE::RadioEntityType::GetAsString_abi_cxx11_(&local_200,&this->m_RadioEntityType);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"Transmit State:             ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitState_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)this->m_ui8TransmitterState,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Input Source:               ");
  DATA_TYPE::ENUMS::GetEnumAsStringRadioInputSource_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)this->m_ui8InputSource,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::AntennaLocation::GetAsString_abi_cxx11_(&local_260,&this->m_AntennaLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"Antenna Pattern Type:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringAntennaPatternType_abi_cxx11_
            (&local_280,(ENUMS *)(ulong)this->m_ui16AntennaPatternType,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Antenna Pattern Length:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16AntennaPatternLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Frequency(hertz):           ");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Transmit Frequency BW:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32TransmitFreqBW);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Power(decibel-milliwatts):  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Power);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::ModulationType::GetAsString_abi_cxx11_(&local_2a0,&this->m_ModulationType);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  DATA_TYPE::CryptoSystem::GetAsString_abi_cxx11_(&local_2c0,&this->m_CryptoSystem);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  poVar1 = std::operator<<(poVar1,"Length Of Modulation Param: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LengthOfModulationParam);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"Variable Params.......NOT IMPLEMENTED\n");
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Transmitter_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transmitter PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << "Radio Entity Type:          " << m_RadioEntityType.GetAsString()
       << "Transmit State:             " << GetEnumAsStringTransmitState ( m_ui8TransmitterState )<< "\n"
       << "Input Source:               " << GetEnumAsStringRadioInputSource( m_ui8InputSource )   << "\n"
       << m_AntennaLocation.GetAsString()
       << "Antenna Pattern Type:       " << GetEnumAsStringAntennaPatternType( m_ui16AntennaPatternType ) << "\n"
       << "Antenna Pattern Length:     " << m_ui16AntennaPatternLength << "\n"
       << "Frequency(hertz):           " << m_ui64Freq                 << "\n"
       << "Transmit Frequency BW:      " << m_f32TransmitFreqBW        << "\n"
       << "Power(decibel-milliwatts):  " << m_f32Power                 << "\n"
       << m_ModulationType.GetAsString()
       << m_CryptoSystem.GetAsString()
       << "Length Of Modulation Param: " << ( KUINT16 )m_ui8LengthOfModulationParam << "\n"
       << "Variable Params.......NOT IMPLEMENTED\n";

    // TODO: Interpretation of the variable params is not provided at the moment. Karl

    return ss.str();
}